

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O0

int Fra_ImpCheckForNode(Fra_Man_t *p,Vec_Int_t *vImps,Aig_Obj_t *pNode,int Pos)

{
  ulong uVar1;
  int iVar2;
  int a;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *p_00;
  Aig_Obj_t *p_01;
  int fComplR;
  int fComplL;
  int RetValue;
  int Max;
  int Right;
  int Left;
  int Imp;
  int i;
  Aig_Obj_t *pRightF;
  Aig_Obj_t *pLeftF;
  Aig_Obj_t *pRight;
  Aig_Obj_t *pLeft;
  int Pos_local;
  Aig_Obj_t *pNode_local;
  Vec_Int_t *vImps_local;
  Fra_Man_t *p_local;
  
  Left = Pos;
  do {
    iVar2 = Vec_IntSize(vImps);
    if (iVar2 <= Left) {
      return Left;
    }
    iVar2 = Vec_IntEntry(vImps,Left);
    if (iVar2 != 0) {
      a = Fra_ImpLeft(iVar2);
      iVar2 = Fra_ImpRight(iVar2);
      iVar3 = Abc_MaxInt(a,iVar2);
      if (iVar3 < pNode->Id) {
        __assert_fail("Max >= pNode->Id",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraImp.c"
                      ,0x204,"int Fra_ImpCheckForNode(Fra_Man_t *, Vec_Int_t *, Aig_Obj_t *, int)");
      }
      if (pNode->Id < iVar3) {
        return Left;
      }
      pAVar6 = Aig_ManObj(p->pManAig,a);
      pAVar7 = Aig_ManObj(p->pManAig,iVar2);
      p_00 = Fra_ObjFraig(pAVar6,p->pPars->nFramesK);
      p_01 = Fra_ObjFraig(pAVar7,p->pPars->nFramesK);
      uVar1 = *(ulong *)&pAVar6->field_0x18;
      uVar4 = Aig_IsComplement(p_00);
      uVar4 = (uint)(uVar1 >> 3) & 1 ^ uVar4;
      uVar1 = *(ulong *)&pAVar7->field_0x18;
      uVar5 = Aig_IsComplement(p_01);
      uVar5 = (uint)(uVar1 >> 3) & 1 ^ uVar5;
      pAVar6 = Aig_Regular(p_00);
      pAVar7 = Aig_Regular(p_01);
      if (pAVar6 == pAVar7) {
        if (uVar4 != uVar5) {
          if (uVar4 == uVar5) {
            __assert_fail("fComplL != fComplR",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraImp.c"
                          ,0x215,
                          "int Fra_ImpCheckForNode(Fra_Man_t *, Vec_Int_t *, Aig_Obj_t *, int)");
          }
          pAVar6 = Aig_Regular(p_00);
          iVar2 = Aig_ObjIsConst1(pAVar6);
          if ((iVar2 == 0) || (uVar4 == 0)) {
            p->pCla->fRefinement = 1;
            Vec_IntWriteEntry(vImps,Left,0);
          }
        }
      }
      else {
        pAVar6 = Aig_Regular(p_00);
        pAVar7 = Aig_Regular(p_01);
        iVar2 = Fra_NodesAreImp(p,pAVar6,pAVar7,uVar4,uVar5);
        if (iVar2 != 1) {
          p->pCla->fRefinement = 1;
          if (iVar2 == 0) {
            Fra_SmlResimulate(p);
          }
          iVar2 = Vec_IntEntry(vImps,Left);
          if (iVar2 != 0) {
            printf("Fra_ImpCheckForNode(): Implication is not refined!\n");
          }
          iVar2 = Vec_IntEntry(vImps,Left);
          if (iVar2 != 0) {
            __assert_fail("Vec_IntEntry(vImps, i) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraImp.c"
                          ,0x22e,
                          "int Fra_ImpCheckForNode(Fra_Man_t *, Vec_Int_t *, Aig_Obj_t *, int)");
          }
        }
      }
    }
    Left = Left + 1;
  } while( true );
}

Assistant:

int Fra_ImpCheckForNode( Fra_Man_t * p, Vec_Int_t * vImps, Aig_Obj_t * pNode, int Pos )
{
    Aig_Obj_t * pLeft, * pRight;
    Aig_Obj_t * pLeftF, * pRightF;
    int i, Imp, Left, Right, Max, RetValue;
    int fComplL, fComplR;
    Vec_IntForEachEntryStart( vImps, Imp, i, Pos )
    {
        if ( Imp == 0 )
            continue;
        Left = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        Max = Abc_MaxInt( Left, Right );
        assert( Max >= pNode->Id );
        if ( Max > pNode->Id )
            return i;
        // get the corresponding nodes
        pLeft  = Aig_ManObj( p->pManAig, Left );
        pRight = Aig_ManObj( p->pManAig, Right );
        // get the corresponding FRAIG nodes
        pLeftF  = Fra_ObjFraig( pLeft, p->pPars->nFramesK );
        pRightF = Fra_ObjFraig( pRight, p->pPars->nFramesK );
        // get the complemented attributes
        fComplL = pLeft->fPhase ^ Aig_IsComplement(pLeftF);
        fComplR = pRight->fPhase ^ Aig_IsComplement(pRightF);
        // check equality
        if ( Aig_Regular(pLeftF) == Aig_Regular(pRightF) )
        {
            if ( fComplL == fComplR ) // x => x  - always true
                continue;
            assert( fComplL != fComplR );
            // consider 4 possibilities:
            // NOT(1) => 1    or   0 => 1  - always true
            // 1 => NOT(1)    or   1 => 0  - never true
            // NOT(x) => x    or   x       - not always true
            // x => NOT(x)    or   NOT(x)  - not always true
            if ( Aig_ObjIsConst1(Aig_Regular(pLeftF)) && fComplL ) // proved implication
                continue;
            // disproved implication
            p->pCla->fRefinement = 1;
            Vec_IntWriteEntry( vImps, i, 0 );
            continue;
        }
        // check the implication 
        // - if true, a clause is added
        // - if false, a cex is simulated
        // make sure the implication is refined
        RetValue = Fra_NodesAreImp( p, Aig_Regular(pLeftF), Aig_Regular(pRightF), fComplL, fComplR );
        if ( RetValue != 1 )
        {
            p->pCla->fRefinement = 1;
            if ( RetValue == 0 )
                Fra_SmlResimulate( p );
            if ( Vec_IntEntry(vImps, i) != 0 )
                printf( "Fra_ImpCheckForNode(): Implication is not refined!\n" );
            assert( Vec_IntEntry(vImps, i) == 0 );
        }
    }
    return i;
}